

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.h
# Opt level: O2

double __thiscall imrt::IntensityILS::perturbation(IntensityILS *this,Plan *P)

{
  int iVar1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *plVar2;
  Station *this_00;
  int iVar3;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double local_48;
  _List_node_base local_40;
  undefined8 local_30;
  
  local_48 = Plan::getEvaluation(P);
  for (iVar3 = 0; iVar3 < this->perturbation_size; iVar3 = iVar3 + 1) {
    iVar1 = rand();
    plVar2 = Plan::get_stations_abi_cxx11_(P);
    this_00 = Plan::get_station(P,(int)((ulong)(long)iVar1 %
                                       (plVar2->
                                       super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>
                                       )._M_impl._M_node._M_size));
    local_30 = 0;
    local_40._M_next = &local_40;
    local_40._M_prev = &local_40;
    Station::reduce_apertures
              (this_00,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       &local_40);
    local_48 = Plan::incremental_eval
                         (P,this_00,
                          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                          &local_40);
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             &local_40);
  }
  this->maxdelta = this->maxdelta0;
  this->maxratio = this->maxratio0;
  return local_48;
}

Assistant:

virtual double perturbation(Plan& P) {
		double eval=P.getEvaluation();
		for(int i=0; i<perturbation_size; i++){
			int r=rand()%P.get_stations().size();
			Station* s=P.get_station(r);
			list< pair< int, double > > diff;
			s->reduce_apertures(diff);
			eval=P.incremental_eval(*s,diff);
		}
		maxdelta=maxdelta0;
		maxratio=maxratio0;

		return(eval);
	}